

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall message_header_write_read::test_method(message_header_write_read *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_1a8;
  basic_cstring<const_char> local_198;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_188;
  undefined1 local_161 [9];
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int_&>,_const_unsigned_int_&,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_int,_void>_>
  local_158;
  assertion_result local_148;
  basic_cstring<const_char> local_130;
  basic_cstring<const_char> local_120;
  basic_cstring<const_char> local_110;
  basic_cstring<const_char> local_100;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_f0;
  message_id local_c9;
  seed local_c8 [8];
  binary_expr<boost::test_tools::assertion::value_expr<message_id_&>,_const_message_id_&,_boost::test_tools::assertion::op::EQ<message_id,_message_id,_void>_>
  local_c0;
  assertion_result local_b0;
  basic_cstring<const_char> local_98;
  basic_cstring<const_char> local_88;
  message_header local_75;
  undefined1 local_70 [3];
  message_header read_header;
  buffer_reader reader;
  undefined1 local_48 [8];
  buffer_writer writer;
  undefined1 local_30 [3];
  message_header write_header;
  buffer buffer;
  message_id id;
  message_size size;
  message_header_write_read *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  writer._start._3_4_ = 0xff55;
  writer._start._7_1_ = 3;
  buffer_writer::buffer_writer
            ((buffer_writer *)local_48,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  ::operator<<((buffer_writer *)local_48,(message_header *)((long)&writer._start + 3));
  buffer_reader::buffer_reader((buffer_reader *)local_70,(buffer *)local_30);
  ::operator>>((buffer_reader *)local_70,&local_75);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_98);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_88,0x76,&local_98);
    boost::test_tools::assertion::seed::operator->*(local_c8,&local_c9);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<message_id&>,message_id>::operator==
              ((expression_base<boost::test_tools::assertion::value_expr<message_id&>,message_id> *)
               &local_c0,(message_id *)local_c8);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<message_id_&>,_const_message_id_&,_boost::test_tools::assertion::op::EQ<message_id,_message_id,_void>_>
    ::evaluate(&local_b0,&local_c0,false);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_100,"read_header.id == id",0x14);
    boost::unit_test::operator<<(&local_f0,plVar3,&local_100);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_110,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion
              (&local_b0,&local_f0.super_lazy_ostream,&local_110,0x76,CHECK,CHECK_BUILT_ASSERTION,0)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_f0);
    boost::test_tools::assertion_result::~assertion_result(&local_b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_130);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_120,0x77,&local_130);
    boost::test_tools::assertion::seed::operator->*((seed *)(local_161 + 1),(uint *)local_161);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_int&>,unsigned_int>::
    operator==((expression_base<boost::test_tools::assertion::value_expr<unsigned_int&>,unsigned_int>
                *)&local_158,(uint *)(local_161 + 1));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_int_&>,_const_unsigned_int_&,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_int,_void>_>
    ::evaluate(&local_148,&local_158,false);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_198,"read_header.size == size",0x18);
    boost::unit_test::operator<<(&local_188,plVar3,&local_198);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion
              (&local_148,&local_188.super_lazy_ostream,&local_1a8,0x77,CHECK,CHECK_BUILT_ASSERTION,
               0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_188);
    boost::test_tools::assertion_result::~assertion_result(&local_148);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(message_header_write_read)
{
    const message_size size = 0xFF55;
    const message_id id = message_id::PING;
    buffer buffer;

    message_header write_header;
    write_header.size = size;
    write_header.id = id;

    buffer_writer writer(buffer);
    writer << write_header;

    buffer_reader reader(buffer);
    message_header read_header;
    reader >> read_header;

    BOOST_TEST(read_header.id == id);
    BOOST_TEST(read_header.size == size);
}